

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer *
Serialize<FStrifeDialogueNode>
          (FSerializer *arc,char *key,FStrifeDialogueNode **node,FStrifeDialogueNode **def)

{
  ushort uVar1;
  FWriter *pFVar2;
  uint uVar3;
  Value *this;
  
  pFVar2 = arc->w;
  if (pFVar2 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      uVar1 = (this->data_).f.flags;
      if ((uVar1 & 0x40) == 0) {
        if (uVar1 != 0) {
          __assert_fail("val->IsUint() || val->IsNull()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x7dc,
                        "FSerializer &Serialize(FSerializer &, const char *, FStrifeDialogueNode *&, FStrifeDialogueNode **)"
                       );
        }
      }
      else {
        uVar3 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetUint(this);
        if (uVar3 < StrifeDialogues.Count) {
          uVar3 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetUint(this);
          *node = StrifeDialogues.Array[uVar3];
          return arc;
        }
      }
      *node = (FStrifeDialogueNode *)0x0;
    }
  }
  else {
    uVar3 = (pFVar2->mInObject).Count;
    if ((((uVar3 == 0) || (def == (FStrifeDialogueNode **)0x0)) ||
        ((pFVar2->mInObject).Array[uVar3 - 1] == false)) || (*node != *def)) {
      FSerializer::WriteKey(arc,key);
      if (*node == (FStrifeDialogueNode *)0x0) {
        FWriter::Null(arc->w);
      }
      else {
        FWriter::Uint(arc->w,(*node)->ThisNodeNum);
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FStrifeDialogueNode *&node, FStrifeDialogueNode **def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || node != *def)
		{
			arc.WriteKey(key);
			if (node == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				arc.w->Uint(node->ThisNodeNum);
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsUint() || val->IsNull());
			if (val->IsNull())
			{
				node = nullptr;
			}
			else if (val->IsUint())
			{
				if (val->GetUint() >= StrifeDialogues.Size())
				{
					node = nullptr;
				}
				else
				{
					node = StrifeDialogues[val->GetUint()];
				}
			}
			else
			{
				Printf(TEXTCOLOR_RED "integer expected for '%s'", key);
				arc.mErrors++;
				node = nullptr;
			}
		}
	}
	return arc;

}